

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListDistinctBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  reference pvVar3;
  pointer pEVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  Expression *local_28;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  local_28 = (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  duckdb::BoundCastExpression::AddArrayCastToList(&local_30);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  _Var2._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (Expression *)0x0;
  _Var1._M_head_impl =
       (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
  }
  if (local_30._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  local_30._M_head_impl = (Expression *)0x0;
  if (local_28 != (Expression *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  local_28 = (Expression *)0x0;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if ((pointer)&bound_function->field_0x90 != pEVar4 + 0x38) {
    bound_function->field_0x90 = pEVar4[0x38];
    bound_function->field_0x91 = pEVar4[0x39];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&bound_function->field_0x98,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar4 + 0x40));
  }
  ListAggregatesBind<false>(this,context,bound_function,arguments);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListDistinctBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {

	D_ASSERT(bound_function.arguments.size() == 1);
	D_ASSERT(arguments.size() == 1);

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	bound_function.return_type = arguments[0]->return_type;

	return ListAggregatesBind<>(context, bound_function, arguments);
}